

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog.hpp
# Opt level: O0

unsigned_long burst::detail::intlog_impl<unsigned_long>(unsigned_long number,unsigned_long base)

{
  undefined8 local_30;
  unsigned_long exponent;
  unsigned_long degree;
  unsigned_long base_local;
  unsigned_long number_local;
  
  exponent = 0;
  for (local_30 = base; local_30 < number; local_30 = base * local_30) {
    exponent = exponent + 1;
  }
  if (local_30 == number) {
    number_local = exponent + 1;
  }
  else {
    number_local = exponent;
  }
  return number_local;
}

Assistant:

constexpr Integer intlog_impl (Integer number, Integer base)
        {
            auto degree = Integer{0};
            auto exponent = base;

            while (exponent < number)
            {
                exponent *= base;
                ++degree;
            }

            if (exponent == number)
            {
                return degree + 1;
            }
            else
            {
                return degree;
            }
        }